

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# infomessages.cpp
# Opt level: O0

void __thiscall CInfoMessages::OnRender(CInfoMessages *this)

{
  int iVar1;
  CConfig *pCVar2;
  IClient *pIVar3;
  IGraphics *pIVar4;
  int *piVar5;
  IGraphics *in_RDI;
  float fVar6;
  CInfoMsg *pInfoMsg;
  int i;
  float y;
  float StartX;
  float Height;
  float Width;
  float in_stack_00000038;
  float in_stack_0000003c;
  CInfoMsg *in_stack_00000040;
  CInfoMessages *in_stack_00000048;
  float in_stack_00000058;
  float in_stack_0000005c;
  CInfoMsg *in_stack_00000060;
  CInfoMessages *in_stack_00000068;
  int local_1c;
  
  pCVar2 = CComponent::Config((CComponent *)0x16b20c);
  if (pCVar2->m_ClShowhud != 0) {
    pIVar3 = CComponent::Client((CComponent *)0x16b21c);
    iVar1 = IClient::State(pIVar3);
    if (2 < iVar1) {
      CComponent::Graphics((CComponent *)0x16b238);
      fVar6 = IGraphics::ScreenAspect(in_RDI);
      pIVar4 = CComponent::Graphics((CComponent *)0x16b26d);
      (*(pIVar4->super_IInterface)._vptr_IInterface[5])(0,0,fVar6 * 1200.0 * 1.5,0x44e10000);
      for (local_1c = 1; local_1c < 6; local_1c = local_1c + 1) {
        piVar5 = (int *)((long)in_RDI +
                        (long)((in_RDI[0x61].m_ScreenWidth + local_1c) % 5) * 0x308 + 0x10);
        pIVar3 = CComponent::Client((CComponent *)0x16b31a);
        iVar1 = IClient::GameTick(pIVar3);
        if (iVar1 <= piVar5[1] + 500) {
          if (*piVar5 == 0) {
            RenderKillMsg(in_stack_00000068,in_stack_00000060,in_stack_0000005c,in_stack_00000058);
          }
          else if (*piVar5 == 1) {
            RenderFinishMsg(in_stack_00000048,in_stack_00000040,in_stack_0000003c,in_stack_00000038)
            ;
          }
        }
      }
    }
  }
  return;
}

Assistant:

void CInfoMessages::OnRender()
{
	if(!Config()->m_ClShowhud || Client()->State() < IClient::STATE_ONLINE)
		return;

	float Width = 400*3.0f*Graphics()->ScreenAspect();
	float Height = 400*3.0f;

	Graphics()->MapScreen(0, 0, Width*1.5f, Height*1.5f);
	float StartX = Width*1.5f-10.0f;
	float y = 20.0f;

	for(int i = 1; i <= MAX_INFOMSGS; i++)
	{
		CInfoMsg *pInfoMsg = &m_aInfoMsgs[(m_InfoMsgCurrent+i)%MAX_INFOMSGS];
		if(Client()->GameTick() > pInfoMsg->m_Tick+50*10)
			continue;

		if(pInfoMsg->m_Type == INFOMSG_KILL)
			RenderKillMsg(pInfoMsg, StartX, y);
		else if(pInfoMsg->m_Type == INFOMSG_FINISH)
			RenderFinishMsg(pInfoMsg, StartX, y);

		y += 46.0f;
	}
}